

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O0

void __thiscall
tchecker::typed_assign_statement_t::typed_assign_statement_t
          (typed_assign_statement_t *this,statement_type_t type,
          shared_ptr<const_tchecker::typed_lvalue_expression_t> *lvalue,
          shared_ptr<const_tchecker::typed_expression_t> *rvalue)

{
  int iVar1;
  element_type *peVar2;
  invalid_argument *this_00;
  shared_ptr<const_tchecker::expression_t> local_48;
  shared_ptr<const_tchecker::lvalue_expression_t> local_38;
  shared_ptr<const_tchecker::typed_expression_t> *local_28;
  shared_ptr<const_tchecker::typed_expression_t> *rvalue_local;
  shared_ptr<const_tchecker::typed_lvalue_expression_t> *lvalue_local;
  typed_assign_statement_t *ptStack_10;
  statement_type_t type_local;
  typed_assign_statement_t *this_local;
  
  local_28 = rvalue;
  rvalue_local = (shared_ptr<const_tchecker::typed_expression_t> *)lvalue;
  lvalue_local._4_4_ = type;
  ptStack_10 = this;
  statement_t::statement_t((statement_t *)this);
  typed_statement_t::typed_statement_t
            (&this->super_typed_statement_t,&PTR_PTR_00348c20,lvalue_local._4_4_);
  std::shared_ptr<tchecker::lvalue_expression_t_const>::
  shared_ptr<tchecker::typed_lvalue_expression_t_const,void>
            ((shared_ptr<tchecker::lvalue_expression_t_const> *)&local_38,
             (shared_ptr<const_tchecker::typed_lvalue_expression_t> *)rvalue_local);
  std::shared_ptr<tchecker::expression_t_const>::shared_ptr<tchecker::typed_expression_t_const,void>
            ((shared_ptr<tchecker::expression_t_const> *)&local_48,local_28);
  assign_statement_t::assign_statement_t
            (&this->super_assign_statement_t,&PTR_construction_vtable_56__00348c30,&local_38,
             &local_48);
  std::shared_ptr<const_tchecker::expression_t>::~shared_ptr(&local_48);
  std::shared_ptr<const_tchecker::lvalue_expression_t>::~shared_ptr(&local_38);
  *(undefined8 *)&this->super_typed_statement_t = 0x348b78;
  *(undefined8 *)&this->super_typed_statement_t = 0x348b78;
  *(undefined8 *)&this->super_assign_statement_t = 0x348be8;
  peVar2 = std::
           __shared_ptr_access<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)rvalue_local);
  iVar1 = (**(code **)(*(long *)&peVar2->super_typed_expression_t + 0x38))();
  if (iVar1 != 1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"invalid lvalue expression");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

typed_assign_statement_t::typed_assign_statement_t(enum tchecker::statement_type_t type,
                                                   std::shared_ptr<tchecker::typed_lvalue_expression_t const> const & lvalue,
                                                   std::shared_ptr<tchecker::typed_expression_t const> const & rvalue)
    : tchecker::typed_statement_t(type), tchecker::assign_statement_t(lvalue, rvalue)
{
  if (lvalue->size() != 1)
    throw std::invalid_argument("invalid lvalue expression");
}